

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O2

MessageBase * __thiscall MessageQueue::PopAndWait(MessageQueue *this)

{
  uint uVar1;
  code *pcVar2;
  DWORD DVar3;
  PAL_FILE *pPVar4;
  ListEntry LVar5;
  
  if ((this->m_queue).head != (DListNode<MessageQueue::ListEntry> *)0x0) {
    LVar5 = SortedList<MessageQueue::ListEntry>::Pop(&this->m_queue);
    uVar1 = (LVar5.message)->m_time;
    DVar3 = GetTickCount();
    DVar3 = uVar1 - DVar3;
    if (0 < (int)DVar3) {
      Sleep(DVar3);
    }
    return LVar5.message;
  }
  pPVar4 = PAL_get_stderr(0);
  PAL_fprintf(pPVar4,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/MessageQueue.h"
              ,0xcd,"!m_queue.IsEmpty()","!m_queue.IsEmpty()");
  pPVar4 = PAL_get_stderr(0);
  PAL_fflush(pPVar4);
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

MessageBase* PopAndWait()
    {
        Assert(!m_queue.IsEmpty());

        ListEntry entry = m_queue.Pop();
        MessageBase *tmp = entry.message;

        int waitTime = tmp->GetTime() - GetTickCount();
        if(waitTime > 0)
        {
            Sleep(waitTime);
        }

        return tmp;
    }